

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O2

void e2e_robust_pattern(fdb_config fconfig)

{
  void *__arg;
  storage_t *psVar1;
  storage_t *psVar2;
  fdb_kvs_handle *__arg_00;
  checkpoint_t *v_chk;
  int iVar3;
  int n;
  idx_prams_t *params;
  long lVar4;
  bool bVar5;
  pthread_t i_tid;
  pthread_t c_tid;
  void *i_ret;
  void *c_ret;
  fdb_kvs_config kvs_config;
  storage_t *local_2d38 [10];
  pthread_t apStack_2ce8 [30];
  pthread_t apStack_2bf8 [10];
  void *apvStack_2ba8 [10];
  void *apvStack_2b58 [10];
  idx_prams_t local_2b08 [10];
  checkpoint_t local_2a18 [10];
  
  fdb_get_default_kvs_config();
  memleak_start();
  rm_storage_fs();
  v_chk = local_2a18;
  params = local_2b08;
  for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
    gen_index_params(params);
    memset(v_chk,0,0x430);
    psVar1 = init_storage(&fconfig,&fconfig,&kvs_config,params,v_chk,true);
    local_2d38[lVar4] = psVar1;
    psVar2 = init_storage(&fconfig,&fconfig,&kvs_config,params,v_chk,true);
    apStack_2ce8[lVar4] = (pthread_t)psVar2;
    *(undefined4 *)psVar2->keyspace = *(undefined4 *)psVar1->keyspace;
    *(undefined2 *)(psVar2->keyspace + 4) = *(undefined2 *)(psVar1->keyspace + 4);
    v_chk = v_chk + 1;
    params = params + 1;
  }
  iVar3 = 100;
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    load_persons(local_2d38[0]);
  }
  pthread_create(&c_tid,(pthread_attr_t *)0x0,compact_thread,&fconfig);
  pthread_create(&i_tid,(pthread_attr_t *)0x0,iterate_thread,&fconfig);
  for (iVar3 = 0; iVar3 != 10; iVar3 = iVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x48; lVar4 = lVar4 + 8) {
      __arg = *(void **)((long)local_2d38 + lVar4);
      *(undefined1 *)((long)__arg + 0x4f) = 0;
      pthread_create((pthread_t *)((long)apStack_2ce8 + lVar4 + 0xa0),(pthread_attr_t *)0x0,
                     writer_thread,__arg);
    }
    for (lVar4 = 0; lVar4 != 0x50; lVar4 = lVar4 + 8) {
      __arg_00 = scan(*(storage_t **)((long)apStack_2ce8 + lVar4),(fdb_kvs_handle *)0x0);
      *(fdb_kvs_handle **)((long)apStack_2ce8 + lVar4 + 0x50) = __arg_00;
      pthread_create((pthread_t *)((long)apStack_2bf8 + lVar4),(pthread_attr_t *)0x0,scan_thread,
                     __arg_00);
    }
    e2e_fdb_commit(local_2d38[9]->main,true);
    for (lVar4 = 0; lVar4 != 0x50; lVar4 = lVar4 + 8) {
      pthread_join(*(pthread_t *)((long)apStack_2bf8 + lVar4),(void **)((long)apvStack_2b58 + lVar4)
                  );
      fdb_kvs_close(*(fdb_kvs_handle **)((long)apStack_2ce8 + lVar4 + 0x50));
    }
    for (lVar4 = 0; lVar4 != 0x48; lVar4 = lVar4 + 8) {
      pthread_join(*(pthread_t *)((long)apStack_2ce8 + lVar4 + 0xa0),
                   (void **)((long)apvStack_2ba8 + lVar4));
      update_index(*(storage_t **)((long)local_2d38 + lVar4),false);
    }
    e2e_fdb_commit(local_2d38[9]->main,false);
  }
  pthread_join(c_tid,&c_ret);
  pthread_join(i_tid,&i_ret);
  for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
    e2e_fdb_close((storage_t *)apStack_2ce8[lVar4]);
    e2e_fdb_close(local_2d38[lVar4]);
  }
  fdb_shutdown();
  memleak_end();
  return;
}

Assistant:

void e2e_robust_pattern(fdb_config fconfig) {

    int i;
    int n_writers = 10;
    int n_scanners = 10;
    storage_t **st = alca(storage_t *, n_writers);
    storage_t **st2 = alca(storage_t *, n_writers);
    checkpoint_t *verification_checkpoint = alca(checkpoint_t, n_writers);
    idx_prams_t *index_params = alca(idx_prams_t, n_writers);
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    thread_t *tid_sc = alca(thread_t, n_scanners);
    void **thread_ret_sc = alca(void *, n_scanners);
    thread_t *tid_wr = alca(thread_t, n_writers);
    void **thread_ret_wr = alca(void *, n_writers);
    fdb_kvs_handle **scan_kv = alca(fdb_kvs_handle *, n_scanners);
    thread_t c_tid, i_tid;
    void *c_ret, *i_ret;

    memleak_start();

    // init
    rm_storage_fs();

    // init storage handles
    // the nth writer is commit handler
    for (i = 0;i < n_writers; ++i) {
        gen_index_params(&index_params[i]);
        memset(&verification_checkpoint[i], 0, sizeof(checkpoint_t));
        st[i] = init_storage(&fconfig, &fconfig, &kvs_config,
                &index_params[i], &verification_checkpoint[i], true);
        st2[i] = init_storage(&fconfig, &fconfig, &kvs_config,
                &index_params[i], &verification_checkpoint[i], true);
        memcpy(st2[i]->keyspace, st[i]->keyspace, KEYSPACE_LEN);
    }

    // load init data
    for (i = 0; i < 100; ++i) {
        load_persons(st[0]);
    }

    thread_create(&c_tid, compact_thread, (void*)&fconfig);
    thread_create(&i_tid, iterate_thread, (void*)&fconfig);

    for (int n = 0; n < 10; ++n) {
        // start writer threads
        for (i = 0; i < n_writers - 1; ++i) {
            st[i]->verify_set = false;
            thread_create(&tid_wr[i], writer_thread, (void*)st[i]);
        }


        // start scanner threads
        for (i = 0; i < n_scanners; ++i) {
            scan_kv[i] = scan(st2[i], NULL);
            thread_create(&tid_sc[i], scan_thread, (void*)scan_kv[i]);
        }

        e2e_fdb_commit(st[n_writers-1]->main, true);

        // join scan threads
        for (i = 0; i < n_scanners; ++i) {
            thread_join(tid_sc[i], &thread_ret_sc[i]);
            fdb_kvs_close(scan_kv[i]);
        }

        // join writer threads
        for (i = 0; i < n_writers - 1; ++i) {
            thread_join(tid_wr[i], &thread_ret_wr[i]);
            update_index(st[i], false);
        }
        e2e_fdb_commit(st[n_writers - 1]->main, false);
    }

    thread_join(c_tid, &c_ret);
    thread_join(i_tid, &i_ret);

    for (i = 0; i < n_writers; ++i) {
        // teardown
        e2e_fdb_close(st2[i]);
        e2e_fdb_close(st[i]);
    }
    fdb_shutdown();

    memleak_end();
}